

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

CallReaction testing::Mock::GetReactionOnUninterestingCalls(void *mock_obj)

{
  unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
  *puVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  CallReaction local_50;
  MutexBase *local_38;
  MutexBase *local_30 [3];
  GTestMutexLock local_18;
  MutexLock l;
  void *mock_obj_local;
  
  l.mutex_ = (MutexBase *)mock_obj;
  internal::GTestMutexLock::GTestMutexLock(&local_18,(MutexBase *)internal::g_gmock_mutex);
  puVar1 = anon_unknown_6::UninterestingCallReactionMap();
  local_30[0] = l.mutex_;
  sVar2 = std::
          unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
          ::count(puVar1,(key_type *)local_30);
  if (sVar2 == 0) {
    local_50 = internal::intToCallReaction(FLAGS_gmock_default_mock_behavior);
  }
  else {
    puVar1 = anon_unknown_6::UninterestingCallReactionMap();
    local_38 = l.mutex_;
    pmVar3 = std::
             unordered_map<unsigned_long,_testing::internal::CallReaction,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>_>
             ::operator[](puVar1,(key_type *)&local_38);
    local_50 = *pmVar3;
  }
  internal::GTestMutexLock::~GTestMutexLock(&local_18);
  return local_50;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  return (UninterestingCallReactionMap().count(
              reinterpret_cast<uintptr_t>(mock_obj)) == 0)
             ? internal::intToCallReaction(
                   GMOCK_FLAG_GET(default_mock_behavior))
             : UninterestingCallReactionMap()[reinterpret_cast<uintptr_t>(
                   mock_obj)];
}